

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt__glTexSubImage2D(djg_texture *texture,GLenum target,GLint xoffset,GLint yoffset)

{
  GLsizei GVar1;
  GLsizei GVar2;
  PFNGLTEXSUBIMAGE2DPROC p_Var3;
  GLint GVar4;
  GLint GVar5;
  bool bVar6;
  int iVar7;
  GLenum GVar8;
  GLenum GVar9;
  GLint local_78;
  bool reset;
  djgt__glpss backup;
  GLint local_48 [2];
  djgt__glpss pus;
  GLint yoffset_local;
  GLint xoffset_local;
  GLenum target_local;
  djg_texture *texture_local;
  
  pus[7] = yoffset;
  pus[8] = xoffset;
  memset(local_48,0,0x24);
  pus[6] = 2;
  djgt__get_glpus(&local_78);
  iVar7 = memcmp(local_48,&local_78,0x24);
  if (iVar7 != 0) {
    djgt__set_glpus(local_48);
  }
  GVar5 = pus[8];
  GVar4 = pus[7];
  p_Var3 = glad_glTexSubImage2D;
  GVar1 = texture->x;
  GVar2 = texture->y;
  GVar8 = djgt__glformat(texture->comp);
  GVar9 = djgt__gltype(texture->pf);
  (*p_Var3)(target,0,GVar5,GVar4,GVar1,GVar2,GVar8,GVar9,texture->texels);
  if (iVar7 != 0) {
    djgt__set_glpus(&local_78);
  }
  bVar6 = djgt__validate();
  return bVar6;
}

Assistant:

static bool
djgt__glTexSubImage2D(
    const djg_texture *texture,
    GLenum target,
    GLint xoffset,
    GLint yoffset
) {
    djgt__glpss pus = {0, 0, 0, 0, 0, 0 ,0, 0, 2};
    djgt__glpss backup;
    bool reset;

    djgt__get_glpus(backup);
    reset = memcmp(pus, backup, sizeof(djgt__glpss)) != 0;
    if (reset) djgt__set_glpus(pus);
    glTexSubImage2D(target,
           /*level*/0,
                    xoffset,
                    yoffset,
                    texture->x,
                    texture->y,
                    djgt__glformat(texture->comp),
                    djgt__gltype(texture->pf),
                    texture->texels);
    if (reset) djgt__set_glpus(backup);

    return djgt__validate();
}